

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

ModuleData ** __thiscall
SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::find
          (SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U> *this,InplaceStr *key)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Node *this_00;
  uint uVar4;
  ModuleData **unaff_R13;
  InplaceStr local_48;
  
  uVar3 = this->bucketCount;
  uVar2 = NULLC::GetStringHash(key->begin,key->end);
  if (this->bucketCount != 0) {
    uVar3 = uVar3 - 1;
    uVar2 = uVar2 & uVar3;
    uVar4 = 0;
    do {
      this_00 = this->data + uVar2;
      local_48.begin = (char *)0x0;
      local_48.end = (char *)0x0;
      bVar1 = InplaceStr::operator==(&this_00->key,&local_48);
      if (bVar1) {
        bVar1 = false;
        unaff_R13 = (ModuleData **)0x0;
      }
      else {
        bVar1 = InplaceStr::operator==(&this_00->key,key);
        if (bVar1) {
          unaff_R13 = &this_00->value;
          bVar1 = false;
        }
        else {
          uVar2 = uVar2 + uVar4 + 1 & uVar3;
          bVar1 = true;
        }
      }
      if (!bVar1) {
        return unaff_R13;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->bucketCount);
  }
  return (ModuleData **)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}